

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

void luaS_clearcache(global_State *g)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      if ((g->strcache[lVar2][lVar4]->marked & 0x18) != 0) {
        g->strcache[lVar2][lVar4] = g->memerrmsg;
      }
      lVar4 = 1;
      bVar1 = false;
    } while (bVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x35);
  return;
}

Assistant:

void luaS_clearcache (global_State *g) {
  int i, j;
  for (i = 0; i < STRCACHE_N; i++)
    for (j = 0; j < STRCACHE_M; j++) {
      if (iswhite(g->strcache[i][j]))  /* will entry be collected? */
        g->strcache[i][j] = g->memerrmsg;  /* replace it with something fixed */
    }
}